

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_TextureMapping::SetCylinderMapping(ON_TextureMapping *this,ON_Cylinder *cylinder,bool bIsCapped)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  ulong uVar4;
  ON_Interval dr;
  ON_Interval local_78;
  double local_68;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  ON_Interval local_30;
  
  ON_Interval::ON_Interval(&local_60);
  ON_Interval::ON_Interval(&local_78);
  bVar2 = ON_IsValid((cylinder->circle).radius);
  if (bVar2) {
    dVar1 = (cylinder->circle).radius;
    uVar4 = -(ulong)(dVar1 == 0.0);
    dVar1 = (double)(~uVar4 & (ulong)dVar1 | uVar4 & 0x3ff0000000000000);
    ON_Interval::Set(&local_60,-dVar1,dVar1);
    ON_Interval::Set(&local_78,cylinder->height[0],cylinder->height[1]);
    pdVar3 = ON_Interval::operator[](&local_78,0);
    local_68 = *pdVar3;
    pdVar3 = ON_Interval::operator[](&local_78,1);
    if ((local_68 == *pdVar3) && (!NAN(local_68) && !NAN(*pdVar3))) {
      pdVar3 = ON_Interval::operator[](&local_78,0);
      if ((*pdVar3 != -1.23432101234321e+308) || (NAN(*pdVar3))) {
        local_78.m_t[0] = local_78.m_t[0] + -1.0 + 1.0;
      }
      else {
        ON_Interval::Set(&local_78,-1.0,1.0);
      }
    }
    bVar2 = ON_Interval::IsValid(&local_78);
    if (bVar2) {
      local_30.m_t[0] = local_60.m_t[0];
      local_30.m_t[1] = local_60.m_t[1];
      local_40.m_t[0] = local_60.m_t[0];
      local_40.m_t[1] = local_60.m_t[1];
      local_50.m_t[0] = local_78.m_t[0];
      local_50.m_t[1] = local_78.m_t[1];
      bVar2 = SetPlaneMapping(this,(ON_Plane *)cylinder,&local_30,&local_40,&local_50);
      if (!bVar2) {
        return bVar2;
      }
      this->m_bCapped = bIsCapped;
      this->m_type = box_mapping;
      this->m_type = cylinder_mapping;
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ON_TextureMapping::SetCylinderMapping(const ON_Cylinder& cylinder, bool bIsCapped)
{
  ON_Interval dr, dh;
  if ( !ON_IsValid(cylinder.circle.radius ) )
    return false;
  double r = cylinder.circle.radius;
  if ( 0.0 == r )
    r = 1.0;
  dr.Set(-r,r);
  dh.Set(cylinder.height[0],cylinder.height[1]);
  if ( dh[0] == dh[1] )
  {
    if ( ON_UNSET_VALUE == dh[0] )
    {
      dh.Set(-1.0,1.0);
    }
    else
    {
      dh.m_t[0] -= 1.0;
      dh.m_t[0] += 1.0;
    }
  }
  if ( !dh.IsValid() )
    return false;

  bool rc = SetBoxMapping(cylinder.circle.plane,dr,dr,dh,bIsCapped);
  if (rc)
  {
	  m_type = ON_TextureMapping::TYPE::cylinder_mapping;
  }

	return rc;
}